

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

bool_t ecpDetIsZero(word *a,word *b,word *p,size_t n,void *stack)

{
  word *b_00;
  word *stack_00;
  bool_t bVar1;
  
  b_00 = (word *)((long)stack + n * 8);
  stack_00 = b_00 + n;
  zzSqrMod((word *)stack,a,p,n,stack_00);
  zzMulMod((word *)stack,(word *)stack,a,p,n,stack_00);
  zzMulWMod((word *)stack,(word *)stack,4,p,n,stack_00);
  zzSqrMod(b_00,b,p,n,stack_00);
  zzMulWMod(b_00,b_00,0x1b,p,n,stack_00);
  zzAddMod((word *)stack,(word *)stack,b_00,p,n);
  bVar1 = wwIsZero((word *)stack,n);
  return bVar1;
}

Assistant:

bool_t ecpDetIsZero(const word a[], const word b[], const word p[], size_t n, 
	void* stack)
{
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// t1 <- 4 A^3
	zzSqrMod(t1, a, p, n, stack);
	zzMulMod(t1, t1, a, p, n, stack);
	zzMulWMod(t1, t1, 4, p, n, stack);
	// t2 <- 27 B^2
	zzSqrMod(t2, b, p, n, stack);
	zzMulWMod(t2, t2, 27, p, n, stack);
	// t1 <- t1 + t2 [4 A^3 + 27 B^2 -- дискриминант]
	zzAddMod(t1, t1, t2, p, n);
	// t1 == 0?
	return wwIsZero(t1, n);
}